

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void unprepare_permutation_ntk(saucy *s)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pObj;
  Nm_Man_t *pNVar5;
  long lVar6;
  char *pName;
  uint uVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = s->pNtk->vPos->nSize;
  lVar11 = (long)iVar1;
  Nm_ManFree(s->pNtk_permuted->pManName);
  pAVar3 = s->pNtk;
  pNVar5 = Nm_ManCreate(pAVar3->vCos->nSize + pAVar3->vCis->nSize + pAVar3->vBoxes->nSize);
  s->pNtk_permuted->pManName = pNVar5;
  if (0 < s->n) {
    lVar10 = 0;
    do {
      lVar6 = lVar10 - lVar11;
      if (lVar10 < lVar11) {
        iVar2 = s->gamma[lVar10];
        if ((((long)iVar2 < 0) || (pVVar4 = s->pNtk->vPos, pVVar4->nSize <= iVar2)) ||
           (pVVar9 = s->pNtk_permuted->vPos, pVVar9->nSize <= lVar10)) {
LAB_002a1674:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar8 = pVVar4->pArray + iVar2;
        lVar6 = lVar10;
      }
      else {
        uVar7 = s->gamma[lVar10] - iVar1;
        if (((((int)uVar7 < 0) || (pVVar4 = s->pNtk->vPis, pVVar4->nSize <= (int)uVar7)) ||
            (lVar10 - lVar11 < 0)) ||
           (pVVar9 = s->pNtk_permuted->vPis, (long)pVVar9->nSize <= lVar10 - lVar11))
        goto LAB_002a1674;
        ppvVar8 = pVVar4->pArray + uVar7;
      }
      pObj = (Abc_Obj_t *)pVVar9->pArray[lVar6];
      pName = Abc_ObjName((Abc_Obj_t *)*ppvVar8);
      Abc_ObjAssignName(pObj,pName,(char *)0x0);
      lVar10 = lVar10 + 1;
    } while (lVar10 < s->n);
  }
  Abc_NtkOrderObjsByName(s->pNtk_permuted,1);
  return;
}

Assistant:

void
unprepare_permutation_ntk(struct saucy *s) 
{       
    int i;
    Abc_Obj_t * pObj, * pObjPerm;
    int numouts = Abc_NtkPoNum(s->pNtk);

    Nm_ManFree( s->pNtk_permuted->pManName );
    s->pNtk_permuted->pManName = Nm_ManCreate( Abc_NtkCiNum(s->pNtk) + Abc_NtkCoNum(s->pNtk) + Abc_NtkBoxNum(s->pNtk) );    

    for (i = 0; i < s->n; ++i) {        
        if (i < numouts) {
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPos, s->gamma[i]);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPos, i);         
        }
        else {          
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPis, s->gamma[i] - numouts);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPis, i - numouts);
            
        }
        Abc_ObjAssignName( pObjPerm, Abc_ObjName(pObj), NULL );         
    }

    Abc_NtkOrderObjsByName( s->pNtk_permuted, 1 );
}